

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

ostream * Catch::TextFlow::operator<<(ostream *os,Column *col)

{
  bool bVar1;
  bool bVar2;
  ostream *in_RDI;
  string line;
  const_iterator __end2;
  const_iterator __begin2;
  Column *__range2;
  bool first;
  const_iterator *in_stack_ffffffffffffff28;
  const_iterator *in_stack_ffffffffffffff30;
  string local_c0 [8];
  const_iterator *in_stack_ffffffffffffff48;
  const_iterator *in_stack_ffffffffffffffa0;
  
  bVar1 = true;
  Column::begin((Column *)in_stack_ffffffffffffff30);
  Column::end((Column *)in_stack_ffffffffffffff30);
  while( true ) {
    bVar2 = Column::const_iterator::operator!=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    if (!bVar2) break;
    Column::const_iterator::operator*[abi_cxx11_(in_stack_ffffffffffffff48);
    if (bVar1) {
      bVar1 = false;
    }
    else {
      std::operator<<(in_RDI,'\n');
    }
    std::operator<<(in_RDI,local_c0);
    std::__cxx11::string::~string(local_c0);
    Column::const_iterator::operator++(in_stack_ffffffffffffffa0);
  }
  return in_RDI;
}

Assistant:

std::ostream& operator<<( std::ostream& os, Column const& col ) {
            bool first = true;
            for ( auto line : col ) {
                if ( first ) {
                    first = false;
                } else {
                    os << '\n';
                }
                os << line;
            }
            return os;
        }